

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *__src;
  uint uVar2;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar3;
  scoped_padder p;
  scoped_padder sStack_78;
  format_int local_50;
  
  uVar1 = getpid();
  uVar2 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  scoped_padder::scoped_padder
            (&sStack_78,
             (ulong)((uVar2 + 1) -
                    (uint)(uVar1 < *(uint *)(::fmt::v6::internal::basic_data<void>::
                                             zero_or_powers_of_10_32 + (ulong)uVar2 * 4))),
             &(this->super_flag_formatter).padinfo_,dest);
  __src = ::fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar1);
  __n = (long)(local_50.buffer_ + 0x15) - (long)__src;
  uVar3 = (dest->super_buffer<char>).size_ + __n;
  local_50.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar3) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar3);
  }
  if (local_50.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar3;
  scoped_padder::~scoped_padder(&sStack_78);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = fmt_helper::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }